

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall QPDFWriter::enqueueObjectsPCLm(QPDFWriter *this)

{
  bool bVar1;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *__x;
  iterator iVar2;
  iterator iVar3;
  string *key;
  QPDFObjectHandle strips;
  QPDFObjectHandle trailer;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> all;
  string image_transform_content;
  allocator<char> local_12a;
  allocator<char> local_129;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_128 [2];
  string *local_108;
  string *local_100;
  QPDFObjectHandle local_f8;
  undefined1 local_e8 [16];
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_d8;
  string local_c8;
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_a8;
  QPDFObjectHandle local_90;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80;
  QPDFObjectHandle local_70;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            (local_50,"q /image Do Q\n",(allocator<char> *)local_128);
  __x = QPDF::getAllPages(((this->m).
                           super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->pdf);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::vector(&local_a8,__x);
  local_108 = (string *)
              local_a8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  key = (string *)
        local_a8.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
        super__Vector_impl_data._M_start;
  while (key != local_108) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
    enqueueObject(this,(QPDFObjectHandle *)&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_128,"/Contents",(allocator<char> *)&local_c8);
    QPDFObjectHandle::getKey(&local_70,key);
    enqueueObject(this,&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_70.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)local_128);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_128,"/Resources",&local_129);
    QPDFObjectHandle::getKey((QPDFObjectHandle *)local_e8,key);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"/XObject",&local_12a);
    local_100 = key;
    QPDFObjectHandle::getKey((QPDFObjectHandle *)(local_e8 + 0x10),(string *)local_e8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 8));
    std::__cxx11::string::~string((string *)local_128);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_128,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 0x10));
    iVar2 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)local_128);
    iVar3 = ::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)local_128);
    for (; iVar2._M_node != iVar3._M_node;
        iVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar2._M_node)) {
      bVar1 = ::qpdf::BaseHandle::null((BaseHandle *)(iVar2._M_node + 2));
      if (!bVar1) {
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_80,
                   (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(iVar2._M_node + 2));
        enqueueObject(this,(QPDFObjectHandle *)&local_80);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
        QPDFObjectHandle::newStream
                  ((QPDF *)&local_90,
                   (string *)
                   ((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->pdf);
        enqueueObject(this,&local_90);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_90.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_128[0]._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_e8 + 0x18));
    key = (string *)&local_100->field_2;
  }
  getTrimmedTrailer((QPDFWriter *)&local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_128,"/Root",(allocator<char> *)(local_e8 + 0x10));
  QPDFObjectHandle::getKey(&local_f8,&local_c8);
  enqueueObject(this,&local_f8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_f8.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)local_128);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
  std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&local_a8);
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

void
QPDFWriter::enqueueObjectsPCLm()
{
    // Image transform stream content for page strip images. Each of this new stream has to come
    // after every page image strip written in the pclm file.
    std::string image_transform_content = "q /image Do Q\n";

    // enqueue all pages first
    std::vector<QPDFObjectHandle> all = m->pdf.getAllPages();
    for (auto& page: all) {
        // enqueue page
        enqueueObject(page);

        // enqueue page contents stream
        enqueueObject(page.getKey("/Contents"));

        // enqueue all the strips for each page
        QPDFObjectHandle strips = page.getKey("/Resources").getKey("/XObject");
        for (auto& image: strips.as_dictionary()) {
            if (!image.second.null()) {
                enqueueObject(image.second);
                enqueueObject(QPDFObjectHandle::newStream(&m->pdf, image_transform_content));
            }
        }
    }

    // Put root in queue.
    QPDFObjectHandle trailer = getTrimmedTrailer();
    enqueueObject(trailer.getKey("/Root"));
}